

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_console.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  TestRunInfo *pTVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  Colour colour;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  poVar5 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam0000000000174700 = 0x7e7e7e7e7e7e7e;
    uRam0000000000174707._0_1_ = '~';
    uRam0000000000174707._1_1_ = '~';
    uRam0000000000174707._2_1_ = '~';
    uRam0000000000174707._3_1_ = '~';
    uRam0000000000174707._4_1_ = '~';
    uRam0000000000174707._5_1_ = '~';
    uRam0000000000174707._6_1_ = '~';
    uRam0000000000174707._7_1_ = '~';
    DAT_001746f0 = '~';
    DAT_001746f0_1._0_1_ = '~';
    DAT_001746f0_1._1_1_ = '~';
    DAT_001746f0_1._2_1_ = '~';
    DAT_001746f0_1._3_1_ = '~';
    DAT_001746f0_1._4_1_ = '~';
    DAT_001746f0_1._5_1_ = '~';
    DAT_001746f0_1._6_1_ = '~';
    uRam00000000001746f8 = 0x7e7e7e7e7e7e7e;
    DAT_001746ff = 0x7e;
    DAT_001746e0 = '~';
    DAT_001746e0_1._0_1_ = '~';
    DAT_001746e0_1._1_1_ = '~';
    DAT_001746e0_1._2_1_ = '~';
    DAT_001746e0_1._3_1_ = '~';
    DAT_001746e0_1._4_1_ = '~';
    DAT_001746e0_1._5_1_ = '~';
    DAT_001746e0_1._6_1_ = '~';
    uRam00000000001746e8._0_1_ = '~';
    uRam00000000001746e8._1_1_ = '~';
    uRam00000000001746e8._2_1_ = '~';
    uRam00000000001746e8._3_1_ = '~';
    uRam00000000001746e8._4_1_ = '~';
    uRam00000000001746e8._5_1_ = '~';
    uRam00000000001746e8._6_1_ = '~';
    uRam00000000001746e8._7_1_ = '~';
    DAT_001746d0 = '~';
    DAT_001746d0_1._0_1_ = '~';
    DAT_001746d0_1._1_1_ = '~';
    DAT_001746d0_1._2_1_ = '~';
    DAT_001746d0_1._3_1_ = '~';
    DAT_001746d0_1._4_1_ = '~';
    DAT_001746d0_1._5_1_ = '~';
    DAT_001746d0_1._6_1_ = '~';
    uRam00000000001746d8._0_1_ = '~';
    uRam00000000001746d8._1_1_ = '~';
    uRam00000000001746d8._2_1_ = '~';
    uRam00000000001746d8._3_1_ = '~';
    uRam00000000001746d8._4_1_ = '~';
    uRam00000000001746d8._5_1_ = '~';
    uRam00000000001746d8._6_1_ = '~';
    uRam00000000001746d8._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam00000000001746c8._0_1_ = '~';
    uRam00000000001746c8._1_1_ = '~';
    uRam00000000001746c8._2_1_ = '~';
    uRam00000000001746c8._3_1_ = '~';
    uRam00000000001746c8._4_1_ = '~';
    uRam00000000001746c8._5_1_ = '~';
    uRam00000000001746c8._6_1_ = '~';
    uRam00000000001746c8._7_1_ = '~';
    DAT_0017470f = 0;
  }
  sVar4 = strlen(&getLineOfChars<(char)126>()::line);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,&getLineOfChars<(char)126>()::line,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  Colour::use(FileName);
  pTVar1 = (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
           nullableValue;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).stream,(pTVar1->name)._M_dataplus._M_p,
                      (pTVar1->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," is a Catch v",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," b",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"master","");
  iVar3 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar3 != 0) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    pcVar2 = DAT_00174488;
    if (DAT_00174488 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar4 = strlen(DAT_00174488);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  }
  poVar5 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Run with -? for options\n\n",0x19);
  iVar3 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xf])();
  if (iVar3 != 0) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Randomness seeded to: ",0x16);
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[0xf])();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::use(None);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }